

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractmodelserialiser.cpp
# Opt level: O1

QList<int> * AbstractModelSerialiser::modelDefaultRoles(void)

{
  int *piVar1;
  QList<int> *in_RDI;
  
  piVar1 = (int *)QArrayData::allocate((QArrayData **)in_RDI,4,8,0xf,KeepSize);
  (in_RDI->d).ptr = piVar1;
  (in_RDI->d).size = 0;
  piVar1[0] = 2;
  piVar1[1] = 1;
  piVar1[2] = 3;
  piVar1[3] = 4;
  piVar1[4] = 5;
  piVar1[5] = 0xd;
  piVar1[6] = 6;
  piVar1[7] = 7;
  piVar1[8] = 8;
  piVar1[9] = 9;
  piVar1[10] = 10;
  piVar1[0xb] = 0xe;
  piVar1[0xb] = 0xe;
  piVar1[0xc] = 0xb;
  piVar1[0xd] = 0xc;
  piVar1[0xe] = 0x100;
  (in_RDI->d).size = 0xf;
  return in_RDI;
}

Assistant:

QList<int> AbstractModelSerialiser::modelDefaultRoles()
{
    return QList<int>{Qt::EditRole,
                      Qt::DecorationRole,
                      Qt::ToolTipRole,
                      Qt::StatusTipRole,
                      Qt::WhatsThisRole,
                      Qt::SizeHintRole,
                      Qt::FontRole,
                      Qt::TextAlignmentRole,
                      Qt::BackgroundRole,
                      Qt::ForegroundRole,
                      Qt::CheckStateRole,
                      Qt::InitialSortOrderRole,
                      Qt::AccessibleTextRole,
                      Qt::AccessibleDescriptionRole,
                      Qt::UserRole};
}